

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.h
# Opt level: O3

void __thiscall
gimage::HighDynamicRangeFusion<unsigned_char>::add
          (HighDynamicRangeFusion<unsigned_char> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,float max_value,int id,
          uint64_t timestamp,bool replace_id)

{
  vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
  *this_00;
  int *piVar1;
  ImageFloat *wp;
  float *pfVar2;
  undefined1 auVar3 [16];
  HighDynamicRangeFusion<unsigned_char> *this_01;
  uint uVar4;
  pointer psVar5;
  invalid_argument *this_02;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  shared_ptr<gimage::HighDynamicRangeFusionBase::Data> p;
  value_type local_48;
  HighDynamicRangeFusion<unsigned_char> *local_38;
  
  psVar5 = (this->super_HighDynamicRangeFusionBase).list.
           super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = 0xffffffff;
  lVar8 = (long)(this->super_HighDynamicRangeFusionBase).list.
                super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar5;
  local_38 = this;
  if (lVar8 != 0) {
    piVar1 = *(int **)&(((psVar5->
                         super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->laplace).
                       super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
    ;
    if (((*(long *)(piVar1 + 2) != image->width) || (*(long *)(piVar1 + 4) != image->height)) ||
       (*piVar1 != image->depth)) {
      this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_02,"HighDynamicRangeFusion::add(): All images must have same size and depth");
      __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    if (-1 < id) {
      uVar6 = 1;
      do {
        uVar4 = (int)uVar6 - 1;
        if (((psVar5->
             super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->id != id) {
          uVar4 = uVar9;
        }
        uVar9 = uVar4;
        if ((ulong)(lVar8 >> 4) <= uVar6) break;
        uVar6 = uVar6 + 1;
        psVar5 = psVar5 + 1;
      } while ((int)uVar9 < 0);
      bVar10 = -1 < (int)uVar9;
      if (bVar10 && !replace_id) {
        return;
      }
      goto LAB_00124556;
    }
  }
  bVar10 = false;
LAB_00124556:
  this_00 = &(this->super_HighDynamicRangeFusionBase).list;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0015f898;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           (local_48.
            super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi + 1);
  *(int *)&local_48.
           super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi[1]._vptr__Sp_counted_base = id;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_use_count = (int)timestamp;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._M_weak_count = (int)(timestamp >> 0x20);
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_use_count = 0;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[2]._M_weak_count = 0;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_use_count = 0;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[3]._M_weak_count = 0;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._M_use_count = 0;
  local_48.super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[4]._M_weak_count = 0;
  if (bVar10) {
    psVar5 = (this_00->
             super__Vector_base<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar9;
    (psVar5->
    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
         = local_48.
           super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(psVar5->
                super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount,
               &local_48.
                super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  else {
    std::
    vector<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>,_std::allocator<std::shared_ptr<gimage::HighDynamicRangeFusionBase::Data>_>_>
    ::push_back(this_00,&local_48);
  }
  this_01 = local_38;
  createLaplacianPyramid<unsigned_char>
            (&(local_48.
               super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->laplace,image);
  std::
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  ::resize(&(local_48.
             super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->weight,
           ((long)((local_48.
                    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->laplace).
                  super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)((local_48.
                    super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->laplace).
                  super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (((local_48.
               super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->weight).
             super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,image->width,image->height,1);
  auVar3 = _DAT_0014f180;
  wp = ((local_48.
         super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->weight).
       super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (this_01->contrast == true) {
    HighDynamicRangeFusionBase::setContrastWeight
              (&this_01->super_HighDynamicRangeFusionBase,wp,
               ((local_48.
                 super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->laplace).
               super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,max_value);
  }
  else {
    lVar8 = wp->n;
    if (lVar8 != 0) {
      lVar7 = -lVar8;
      if (0 < lVar8) {
        lVar7 = lVar8;
      }
      pfVar2 = wp->pixel;
      lVar8 = lVar7 + -1;
      auVar11._8_4_ = (int)lVar8;
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
      uVar6 = 0;
      auVar11 = auVar11 ^ _DAT_0014f180;
      auVar13 = _DAT_0014f160;
      auVar14 = _DAT_0014f170;
      do {
        auVar15 = auVar14 ^ auVar3;
        iVar12 = auVar11._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar12 && auVar11._0_4_ < auVar15._0_4_ ||
                    iVar12 < auVar15._4_4_) & 1)) {
          pfVar2[uVar6] = 1.0;
        }
        if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
            auVar15._12_4_ <= auVar11._12_4_) {
          pfVar2[uVar6 + 1] = 1.0;
        }
        auVar15 = auVar13 ^ auVar3;
        iVar16 = auVar15._4_4_;
        if (iVar16 <= iVar12 && (iVar16 != iVar12 || auVar15._0_4_ <= auVar11._0_4_)) {
          pfVar2[uVar6 + 2] = 1.0;
          pfVar2[uVar6 + 3] = 1.0;
        }
        uVar6 = uVar6 + 4;
        lVar8 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar8 + 4;
        lVar8 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 4;
        auVar13._8_8_ = lVar8 + 4;
      } while ((lVar7 + 3U & 0xfffffffffffffffc) != uVar6);
    }
  }
  if (this_01->well_exposedness == true) {
    mulWellExposednessWeight
              (this_01,((local_48.
                         super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->weight).
                       super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,image,max_value);
  }
  if ((this_01->saturation == true) && (1 < image->depth)) {
    mulSaturationWeight(this_01,((local_48.
                                  super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->weight).
                                super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,image,max_value);
  }
  if (local_48.
      super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<gimage::HighDynamicRangeFusionBase::Data,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void add(const Image<T> &image, float max_value=255, int id=-1, uint64_t timestamp=0,
      bool replace_id=true)
    {
      // check that image has same size and depth as previous images

      if (list.size() > 0 && (list[0]->laplace[0].getWidth() != image.getWidth() ||
          list[0]->laplace[0].getHeight() != image.getHeight() ||
          list[0]->laplace[0].getDepth() != image.getDepth()))
      {
        throw std::invalid_argument("HighDynamicRangeFusion::add(): All images must have same size and depth");
      }

      // find existing data set with the same id

      int k=-1;
      if (id >= 0)
      {
        for (size_t i=0; i<list.size() && k < 0; i++)
        {
          if (list[i]->id == id)
          {
            k=static_cast<int>(i);
          }
        }
      }

      if (k >= 0 && !replace_id)
      {
        return;
      }

      // add, replace or skip data set, depending on the id and replace_id

      std::shared_ptr<Data> p=std::make_shared<Data>(id, timestamp);

      if (k >= 0)
      {
        list[k]=p;
      }
      else
      {
        list.push_back(p);
      }

      // create Laplace pyramid from image

      createLaplacianPyramid(p->laplace, image);

      // compute weights for highest resolution

      p->weight.resize(p->laplace.size());
      p->weight[0].setSize(image.getWidth(), image.getHeight(), 1);

      // weight according to local contrast

      if (contrast)
      {
        setContrastWeight(p->weight[0], p->laplace[0], max_value);
      }
      else
      {
        p->weight[0]=1;
      }

      // weight according to exposedness, i.e. not under- or overexposed

      if (well_exposedness)
      {
        mulWellExposednessWeight(p->weight[0], image, max_value);
      }

      // if color image, weight according to saturation

      if (saturation && image.getDepth() > 1)
      {
        mulSaturationWeight(p->weight[0], image, max_value);
      }
    }